

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber_test.cc
# Opt level: O2

void KyberFileTest(FileTest *t)

{
  long *plVar1;
  int iVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *pcVar3;
  char *in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> in_04;
  Span<const_unsigned_char> in_05;
  Span<const_unsigned_char> in_06;
  AssertionResult gtest_ar_3;
  uint8_t corrupted_decapsulated_key [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_4f40;
  CBB cbb;
  AssertionResult gtest_ar_8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_encap_entropy_pre_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_generate_entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shared_secret_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> private_key_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key_expected;
  Bytes local_4e08;
  uint8_t encapsulated_key [32];
  uint8_t encap_entropy [32];
  uint8_t corrupted_ciphertext [1088];
  uint8_t decapsulated_key [32];
  uint8_t gen_key_entropy [64];
  Bytes local_4918;
  CBS encoded_public_key_cbs;
  uint8_t encoded_public_key [1184];
  uint8_t encoded_private_key [2400];
  KYBER_private_key priv;
  uint8_t ciphertext [1088];
  KYBER_public_key pub;
  
  seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shared_secret_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shared_secret_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shared_secret_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  given_generate_entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  given_generate_entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  given_generate_entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  given_encap_entropy_pre_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  given_encap_entropy_pre_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  given_encap_entropy_pre_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&priv,"count",(allocator<char> *)&pub);
  FileTest::HasAttribute(t,(string *)&priv);
  std::__cxx11::string::~string((string *)&priv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&priv,"seed",(allocator<char> *)encoded_private_key);
  pub.opaque.bytes[0] = FileTest::GetBytes(t,&seed,(string *)&priv);
  pub.opaque._8_8_ = 0;
  std::__cxx11::string::~string((string *)&priv);
  if (pub.opaque.bytes[0] == '\0') {
    testing::Message::Message((Message *)encoded_private_key);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&priv,(internal *)&pub,(AssertionResult *)"t->GetBytes(&seed, \"seed\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)encoded_public_key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
               ,0x77,(char *)priv.opaque._0_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
LAB_002cdd9f:
    this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&pub.opaque + 8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)encoded_public_key);
    std::__cxx11::string::~string((string *)&priv);
    if (encoded_private_key._0_8_ != 0) {
      (**(code **)(*(long *)encoded_private_key._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"pk",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&public_key_expected,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)"t->GetBytes(&public_key_expected, \"pk\")","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x78,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"sk",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&private_key_expected,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)"t->GetBytes(&private_key_expected, \"sk\")","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x79,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"ct",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&ciphertext_expected,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)"t->GetBytes(&ciphertext_expected, \"ct\")","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x7a,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"ss",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&shared_secret_expected,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)"t->GetBytes(&shared_secret_expected, \"ss\")","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x7b,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"generateEntropy",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&given_generate_entropy,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)"t->GetBytes(&given_generate_entropy, \"generateEntropy\")",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x7c,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&priv,"encapEntropyPreHash",(allocator<char> *)encoded_private_key);
    pub.opaque.bytes[0] = FileTest::GetBytes(t,&given_encap_entropy_pre_hash,(string *)&priv);
    pub.opaque._8_8_ = 0;
    std::__cxx11::string::~string((string *)&priv);
    if (pub.opaque.bytes[0] == '\0') {
      testing::Message::Message((Message *)encoded_private_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&priv,(internal *)&pub,
                 (AssertionResult *)
                 "t->GetBytes(&given_encap_entropy_pre_hash, \"encapEntropyPreHash\")","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)encoded_public_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x7e,(char *)priv.opaque._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)encoded_public_key,(Message *)encoded_private_key);
      goto LAB_002cdd9f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&pub.opaque + 8));
    cbb.child = (CBB *)(seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       -(long)seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    corrupted_decapsulated_key[0] = '0';
    corrupted_decapsulated_key[1] = '\0';
    corrupted_decapsulated_key[2] = '\0';
    corrupted_decapsulated_key[3] = '\0';
    corrupted_decapsulated_key[4] = '\0';
    corrupted_decapsulated_key[5] = '\0';
    corrupted_decapsulated_key[6] = '\0';
    corrupted_decapsulated_key[7] = '\0';
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)corrupted_ciphertext,"seed.size()","size_t{48}",(unsigned_long *)&cbb,
               (unsigned_long *)corrupted_decapsulated_key);
    if (corrupted_ciphertext[0] != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(corrupted_ciphertext + 8));
      corrupted_decapsulated_key._0_8_ =
           CTR_DRBG_new(seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,(uint8_t *)0x0,0);
      cbb.is_child = '\0';
      cbb._9_7_ = 0;
      cbb.child = (CBB *)CONCAT71(cbb.child._1_7_,
                                  (CTR_DRBG_STATE *)corrupted_decapsulated_key._0_8_ !=
                                  (CTR_DRBG_STATE *)0x0);
      if ((CTR_DRBG_STATE *)corrupted_decapsulated_key._0_8_ == (CTR_DRBG_STATE *)0x0) {
        testing::Message::Message((Message *)&gtest_ar_3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)corrupted_ciphertext,(internal *)&cbb,(AssertionResult *)"state",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4f40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x90,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                          CONCAT13(corrupted_ciphertext[3],
                                                   CONCAT21(corrupted_ciphertext._1_2_,
                                                            corrupted_ciphertext[0]))));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cbb.is_child);
        iVar2 = CTR_DRBG_generate((CTR_DRBG_STATE *)corrupted_decapsulated_key._0_8_,gen_key_entropy
                                  ,0x20,(uint8_t *)0x0,0);
        cbb.is_child = '\0';
        cbb._9_7_ = 0;
        cbb.child = (CBB *)CONCAT71(cbb.child._1_7_,iVar2 != 0);
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&gtest_ar_3);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)corrupted_ciphertext,(internal *)&cbb,
                     (AssertionResult *)
                     "CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4f40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                     ,0x92,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                            CONCAT13(corrupted_ciphertext[3],
                                                     CONCAT21(corrupted_ciphertext._1_2_,
                                                              corrupted_ciphertext[0]))));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&cbb.is_child);
          iVar2 = CTR_DRBG_generate((CTR_DRBG_STATE *)corrupted_decapsulated_key._0_8_,
                                    gen_key_entropy + 0x20,0x20,(uint8_t *)0x0,0);
          cbb.is_child = '\0';
          cbb._9_7_ = 0;
          cbb.child = (CBB *)CONCAT71(cbb.child._1_7_,iVar2 != 0);
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&gtest_ar_3);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)corrupted_ciphertext,(internal *)&cbb,
                       (AssertionResult *)
                       "CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0x94,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                              CONCAT13(corrupted_ciphertext[3],
                                                       CONCAT21(corrupted_ciphertext._1_2_,
                                                                corrupted_ciphertext[0]))));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&cbb.is_child);
            iVar2 = CTR_DRBG_generate((CTR_DRBG_STATE *)corrupted_decapsulated_key._0_8_,
                                      encap_entropy,0x20,(uint8_t *)0x0,0);
            cbb.is_child = '\0';
            cbb._9_7_ = 0;
            cbb.child = (CBB *)CONCAT71(cbb.child._1_7_,iVar2 != 0);
            if (iVar2 != 0) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbb.is_child);
              std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                         corrupted_decapsulated_key);
              in.size_ = 0x40;
              in.data_ = gen_key_entropy;
              Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           corrupted_ciphertext,in);
              corrupted_decapsulated_key._8_8_ =
                   corrupted_ciphertext._8_8_ -
                   CONCAT44(corrupted_ciphertext._4_4_,
                            CONCAT13(corrupted_ciphertext[3],
                                     CONCAT21(corrupted_ciphertext._1_2_,corrupted_ciphertext[0])));
              gtest_ar_3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )((long)given_generate_entropy.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)given_generate_entropy.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              gtest_ar_3._0_8_ =
                   given_generate_entropy.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)&cbb,"Bytes(Declassified(gen_key_entropy))",
                         "Bytes(given_generate_entropy)",(Bytes *)corrupted_decapsulated_key,
                         (Bytes *)&gtest_ar_3);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         corrupted_ciphertext);
              if ((char)cbb.child == '\0') {
                testing::Message::Message((Message *)corrupted_ciphertext);
                if (cbb._8_8_ == 0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)cbb._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)corrupted_decapsulated_key,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                           ,0x9a,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)corrupted_decapsulated_key,
                           (Message *)corrupted_ciphertext);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)corrupted_decapsulated_key);
                plVar1 = (long *)CONCAT44(corrupted_ciphertext._4_4_,
                                          CONCAT13(corrupted_ciphertext[3],
                                                   CONCAT21(corrupted_ciphertext._1_2_,
                                                            corrupted_ciphertext[0])));
                if (plVar1 != (long *)0x0) {
                  (**(code **)(*plVar1 + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbb.is_child);
              in_00.size_ = 0x20;
              in_00.data_ = encap_entropy;
              Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           corrupted_ciphertext,in_00);
              corrupted_decapsulated_key._0_8_ =
                   CONCAT44(corrupted_ciphertext._4_4_,
                            CONCAT13(corrupted_ciphertext[3],
                                     CONCAT21(corrupted_ciphertext._1_2_,corrupted_ciphertext[0])));
              corrupted_decapsulated_key._8_8_ =
                   corrupted_ciphertext._8_8_ - corrupted_decapsulated_key._0_8_;
              gtest_ar_3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )((long)given_encap_entropy_pre_hash.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)given_encap_entropy_pre_hash.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              gtest_ar_3._0_8_ =
                   given_encap_entropy_pre_hash.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)&cbb,"Bytes(Declassified(encap_entropy))",
                         "Bytes(given_encap_entropy_pre_hash)",(Bytes *)corrupted_decapsulated_key,
                         (Bytes *)&gtest_ar_3);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                         corrupted_ciphertext);
              if ((char)cbb.child == '\0') {
                testing::Message::Message((Message *)corrupted_ciphertext);
                if (cbb._8_8_ == 0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)cbb._8_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)corrupted_decapsulated_key,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                           ,0x9c,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)corrupted_decapsulated_key,
                           (Message *)corrupted_ciphertext);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)corrupted_decapsulated_key);
                plVar1 = (long *)CONCAT44(corrupted_ciphertext._4_4_,
                                          CONCAT13(corrupted_ciphertext[3],
                                                   CONCAT21(corrupted_ciphertext._1_2_,
                                                            corrupted_ciphertext[0])));
                if (plVar1 != (long *)0x0) {
                  (**(code **)(*plVar1 + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbb.is_child);
              BORINGSSL_keccak(encap_entropy,0x20,encap_entropy,0x20,boringssl_sha3_256);
              KYBER_generate_key_external_entropy(encoded_public_key,&priv,gen_key_entropy);
              CBB_init_fixed(&cbb,encoded_private_key,0x960);
              iVar2 = KYBER_marshal_private_key(&cbb,&priv);
              corrupted_decapsulated_key[8] = '\0';
              corrupted_decapsulated_key[9] = '\0';
              corrupted_decapsulated_key[10] = '\0';
              corrupted_decapsulated_key[0xb] = '\0';
              corrupted_decapsulated_key[0xc] = '\0';
              corrupted_decapsulated_key[0xd] = '\0';
              corrupted_decapsulated_key[0xe] = '\0';
              corrupted_decapsulated_key[0xf] = '\0';
              corrupted_decapsulated_key[0] = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&gtest_ar_3);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)corrupted_ciphertext,(internal *)corrupted_decapsulated_key,
                           (AssertionResult *)"KYBER_marshal_private_key(&cbb, &priv)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_4f40,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                           ,0xa5,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                                  CONCAT13(corrupted_ciphertext[3],
                                                           CONCAT21(corrupted_ciphertext._1_2_,
                                                                    corrupted_ciphertext[0]))));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(corrupted_decapsulated_key + 8));
                encoded_public_key_cbs.len = 0x4a0;
                encoded_public_key_cbs.data = encoded_public_key;
                iVar2 = KYBER_parse_public_key(&pub,&encoded_public_key_cbs);
                corrupted_decapsulated_key[8] = '\0';
                corrupted_decapsulated_key[9] = '\0';
                corrupted_decapsulated_key[10] = '\0';
                corrupted_decapsulated_key[0xb] = '\0';
                corrupted_decapsulated_key[0xc] = '\0';
                corrupted_decapsulated_key[0xd] = '\0';
                corrupted_decapsulated_key[0xe] = '\0';
                corrupted_decapsulated_key[0xf] = '\0';
                corrupted_decapsulated_key[0] = iVar2 != 0;
                if (iVar2 != 0) {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(corrupted_decapsulated_key + 8));
                  KYBER_encap_external_entropy(ciphertext,encapsulated_key,&pub,encap_entropy);
                  KYBER_decap(decapsulated_key,ciphertext,&priv);
                  in_01.size_ = 0x20;
                  in_01.data_ = encapsulated_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               corrupted_ciphertext,in_01);
                  local_4f40._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(corrupted_ciphertext._8_8_ -
                                CONCAT44(corrupted_ciphertext._4_4_,
                                         CONCAT13(corrupted_ciphertext[3],
                                                  CONCAT21(corrupted_ciphertext._1_2_,
                                                           corrupted_ciphertext[0]))));
                  in_02.size_ = 0x20;
                  in_02.data_ = decapsulated_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               corrupted_decapsulated_key,in_02);
                  gtest_ar_8.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(corrupted_decapsulated_key._8_8_ - corrupted_decapsulated_key._0_8_);
                  gtest_ar_8.success_ = (bool)corrupted_decapsulated_key[0];
                  gtest_ar_8._1_1_ = corrupted_decapsulated_key[1];
                  gtest_ar_8._2_1_ = corrupted_decapsulated_key[2];
                  gtest_ar_8._3_1_ = corrupted_decapsulated_key[3];
                  gtest_ar_8._4_1_ = corrupted_decapsulated_key[4];
                  gtest_ar_8._5_1_ = corrupted_decapsulated_key[5];
                  gtest_ar_8._6_1_ = corrupted_decapsulated_key[6];
                  gtest_ar_8._7_1_ = corrupted_decapsulated_key[7];
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)&gtest_ar_3,"Bytes(Declassified(encapsulated_key))",
                             "Bytes(Declassified(decapsulated_key))",(Bytes *)&local_4f40,
                             (Bytes *)&gtest_ar_8);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             corrupted_decapsulated_key);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             corrupted_ciphertext);
                  if (gtest_ar_3.success_ == false) {
                    testing::Message::Message((Message *)corrupted_ciphertext);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)gtest_ar_3.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)corrupted_decapsulated_key,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xaf,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)corrupted_decapsulated_key,
                               (Message *)corrupted_ciphertext);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)corrupted_decapsulated_key);
                    plVar1 = (long *)CONCAT44(corrupted_ciphertext._4_4_,
                                              CONCAT13(corrupted_ciphertext[3],
                                                       CONCAT21(corrupted_ciphertext._1_2_,
                                                                corrupted_ciphertext[0])));
                    if (plVar1 != (long *)0x0) {
                      (**(code **)(*plVar1 + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_3.message_);
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )((long)private_key_expected.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)private_key_expected.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
                  gtest_ar_3._0_8_ =
                       private_key_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  in_03.size_ = 0x960;
                  in_03.data_ = encoded_private_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               corrupted_ciphertext,in_03);
                  local_4f40._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(corrupted_ciphertext._8_8_ -
                                CONCAT44(corrupted_ciphertext._4_4_,
                                         CONCAT13(corrupted_ciphertext[3],
                                                  CONCAT21(corrupted_ciphertext._1_2_,
                                                           corrupted_ciphertext[0]))));
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)corrupted_decapsulated_key,"Bytes(private_key_expected)",
                             "Bytes(Declassified(encoded_private_key))",(Bytes *)&gtest_ar_3,
                             (Bytes *)&local_4f40);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             corrupted_ciphertext);
                  if (corrupted_decapsulated_key[0] == '\0') {
                    testing::Message::Message((Message *)corrupted_ciphertext);
                    if (corrupted_decapsulated_key._8_8_ == 0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)corrupted_decapsulated_key._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xb1,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3,(Message *)corrupted_ciphertext);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
                    plVar1 = (long *)CONCAT44(corrupted_ciphertext._4_4_,
                                              CONCAT13(corrupted_ciphertext[3],
                                                       CONCAT21(corrupted_ciphertext._1_2_,
                                                                corrupted_ciphertext[0])));
                    if (plVar1 != (long *)0x0) {
                      (**(code **)(*plVar1 + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(corrupted_decapsulated_key + 8));
                  corrupted_decapsulated_key._8_8_ =
                       (long)public_key_expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)public_key_expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  corrupted_decapsulated_key._0_8_ =
                       public_key_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x4a0;
                  gtest_ar_3._0_8_ = encoded_public_key;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)corrupted_ciphertext,"Bytes(public_key_expected)",
                             "Bytes(encoded_public_key)",(Bytes *)corrupted_decapsulated_key,
                             (Bytes *)&gtest_ar_3);
                  if (corrupted_ciphertext[0] == '\0') {
                    testing::Message::Message((Message *)corrupted_decapsulated_key);
                    if (corrupted_ciphertext._8_8_ == 0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)corrupted_ciphertext._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xb2,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3,(Message *)corrupted_decapsulated_key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
                    if (corrupted_decapsulated_key._0_8_ != 0) {
                      (**(code **)(*(long *)corrupted_decapsulated_key._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(corrupted_ciphertext + 8));
                  corrupted_decapsulated_key._8_8_ =
                       (long)ciphertext_expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)ciphertext_expected.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  corrupted_decapsulated_key._0_8_ =
                       ciphertext_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x440;
                  gtest_ar_3._0_8_ = ciphertext;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)corrupted_ciphertext,"Bytes(ciphertext_expected)",
                             "Bytes(ciphertext)",(Bytes *)corrupted_decapsulated_key,
                             (Bytes *)&gtest_ar_3);
                  if (corrupted_ciphertext[0] == '\0') {
                    testing::Message::Message((Message *)corrupted_decapsulated_key);
                    if (corrupted_ciphertext._8_8_ == 0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)corrupted_ciphertext._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xb3,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3,(Message *)corrupted_decapsulated_key);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
                    if (corrupted_decapsulated_key._0_8_ != 0) {
                      (**(code **)(*(long *)corrupted_decapsulated_key._0_8_ + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(corrupted_ciphertext + 8));
                  gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )((long)shared_secret_expected.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)shared_secret_expected.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
                  gtest_ar_3._0_8_ =
                       shared_secret_expected.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
                  in_04.size_ = 0x20;
                  in_04.data_ = encapsulated_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               corrupted_ciphertext,in_04);
                  local_4f40._M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(corrupted_ciphertext._4_4_,
                                         CONCAT13(corrupted_ciphertext[3],
                                                  CONCAT21(corrupted_ciphertext._1_2_,
                                                           corrupted_ciphertext[0])));
                  local_4f40._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(corrupted_ciphertext._8_8_ -
                                (long)local_4f40._M_impl.super__Vector_impl_data._M_start);
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)corrupted_decapsulated_key,"Bytes(shared_secret_expected)",
                             "Bytes(Declassified(encapsulated_key))",(Bytes *)&gtest_ar_3,
                             (Bytes *)&local_4f40);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             corrupted_ciphertext);
                  if (corrupted_decapsulated_key[0] == '\0') {
                    testing::Message::Message((Message *)corrupted_ciphertext);
                    if (corrupted_decapsulated_key._8_8_ == 0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)corrupted_decapsulated_key._8_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xb5,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3,(Message *)corrupted_ciphertext);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
                    plVar1 = (long *)CONCAT44(corrupted_ciphertext._4_4_,
                                              CONCAT13(corrupted_ciphertext[3],
                                                       CONCAT21(corrupted_ciphertext._1_2_,
                                                                corrupted_ciphertext[0])));
                    if (plVar1 != (long *)0x0) {
                      (**(code **)(*plVar1 + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(corrupted_decapsulated_key + 8));
                  memcpy(corrupted_ciphertext,ciphertext,0x440);
                  corrupted_ciphertext[3] = corrupted_ciphertext[3] ^ 0x40;
                  KYBER_decap(corrupted_decapsulated_key,corrupted_ciphertext,&priv);
                  in_05.size_ = 0x20;
                  in_05.data_ = encapsulated_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_3,
                               in_05);
                  local_4e08.span_.size_ =
                       (long)gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl - gtest_ar_3._0_8_;
                  local_4e08.span_.data_ = (uchar *)gtest_ar_3._0_8_;
                  in_06.size_ = 0x20;
                  in_06.data_ = corrupted_decapsulated_key;
                  Declassified((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4f40,
                               in_06);
                  local_4918.span_.size_ =
                       (long)local_4f40._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_4f40._M_impl.super__Vector_impl_data._M_start;
                  local_4918.span_.data_ = local_4f40._M_impl.super__Vector_impl_data._M_start;
                  testing::internal::CmpHelperNE<Bytes,Bytes>
                            ((internal *)&gtest_ar_8,"Bytes(Declassified(encapsulated_key))",
                             "Bytes(Declassified(corrupted_decapsulated_key))",&local_4e08,
                             &local_4918);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            (&local_4f40);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &gtest_ar_3);
                  if (gtest_ar_8.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_3);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_8.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)gtest_ar_8.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_4f40,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0xc0,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f40);
                    if (gtest_ar_3._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
                    }
                  }
                  this = &gtest_ar_8.message_;
                  goto LAB_002cddcf;
                }
                testing::Message::Message((Message *)&gtest_ar_3);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)corrupted_ciphertext,(internal *)corrupted_decapsulated_key,
                           (AssertionResult *)
                           "KYBER_parse_public_key(&pub, &encoded_public_key_cbs)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_4f40,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                           ,0xa9,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                                  CONCAT13(corrupted_ciphertext[3],
                                                           CONCAT21(corrupted_ciphertext._1_2_,
                                                                    corrupted_ciphertext[0]))));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
              }
              this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(corrupted_decapsulated_key + 8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f40);
              std::__cxx11::string::~string((string *)corrupted_ciphertext);
              if (gtest_ar_3._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
              }
              goto LAB_002cddcf;
            }
            testing::Message::Message((Message *)&gtest_ar_3);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)corrupted_ciphertext,(internal *)&cbb,
                       (AssertionResult *)
                       "CTR_DRBG_generate(state.get(), encap_entropy, 32, nullptr, 0)","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4f40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0x96,(char *)CONCAT44(corrupted_ciphertext._4_4_,
                                              CONCAT13(corrupted_ciphertext[3],
                                                       CONCAT21(corrupted_ciphertext._1_2_,
                                                                corrupted_ciphertext[0]))));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4f40,(Message *)&gtest_ar_3);
          }
        }
      }
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f40);
      std::__cxx11::string::~string((string *)corrupted_ciphertext);
      if (gtest_ar_3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cbb.is_child);
      std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                 corrupted_decapsulated_key);
      goto LAB_002cddd4;
    }
    testing::Message::Message((Message *)&cbb);
    if (corrupted_ciphertext._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)corrupted_ciphertext._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)corrupted_decapsulated_key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)corrupted_decapsulated_key,(Message *)&cbb);
    this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(corrupted_ciphertext + 8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)corrupted_decapsulated_key);
    if (cbb.child != (CBB *)0x0) {
      (**(code **)&(cbb.child)->child->is_child)();
    }
  }
LAB_002cddcf:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
LAB_002cddd4:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&given_encap_entropy_pre_hash.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&given_generate_entropy.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&shared_secret_expected.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&seed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void KyberFileTest(FileTest *t) {
  std::vector<uint8_t> seed, public_key_expected, private_key_expected,
      ciphertext_expected, shared_secret_expected, given_generate_entropy,
      given_encap_entropy_pre_hash;
  t->IgnoreAttribute("count");
  ASSERT_TRUE(t->GetBytes(&seed, "seed"));
  ASSERT_TRUE(t->GetBytes(&public_key_expected, "pk"));
  ASSERT_TRUE(t->GetBytes(&private_key_expected, "sk"));
  ASSERT_TRUE(t->GetBytes(&ciphertext_expected, "ct"));
  ASSERT_TRUE(t->GetBytes(&shared_secret_expected, "ss"));
  ASSERT_TRUE(t->GetBytes(&given_generate_entropy, "generateEntropy"));
  ASSERT_TRUE(
      t->GetBytes(&given_encap_entropy_pre_hash, "encapEntropyPreHash"));

  KYBER_private_key priv;
  uint8_t encoded_private_key[KYBER_PRIVATE_KEY_BYTES];
  KYBER_public_key pub;
  uint8_t encoded_public_key[KYBER_PUBLIC_KEY_BYTES];
  uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES];
  uint8_t gen_key_entropy[KYBER_GENERATE_KEY_ENTROPY];
  uint8_t encap_entropy[KYBER_ENCAP_ENTROPY];
  uint8_t encapsulated_key[KYBER_SHARED_SECRET_BYTES];
  uint8_t decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  // The test vectors provide a CTR-DRBG seed which is used to generate the
  // input entropy.
  ASSERT_EQ(seed.size(), size_t{CTR_DRBG_ENTROPY_LEN});
  CONSTTIME_SECRET(seed.data(), seed.size());
  {
    bssl::UniquePtr<CTR_DRBG_STATE> state(
        CTR_DRBG_new(seed.data(), nullptr, 0));
    ASSERT_TRUE(state);
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0));
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0));
    ASSERT_TRUE(CTR_DRBG_generate(state.get(), encap_entropy,
                                  KYBER_ENCAP_ENTROPY, nullptr, 0));
  }

  EXPECT_EQ(Bytes(Declassified(gen_key_entropy)),
            Bytes(given_generate_entropy));
  EXPECT_EQ(Bytes(Declassified(encap_entropy)),
            Bytes(given_encap_entropy_pre_hash));

  BORINGSSL_keccak(encap_entropy, sizeof(encap_entropy), encap_entropy,
                   sizeof(encap_entropy), boringssl_sha3_256);

  KYBER_generate_key_external_entropy(encoded_public_key, &priv,
                                      gen_key_entropy);
  CBB cbb;
  CBB_init_fixed(&cbb, encoded_private_key, sizeof(encoded_private_key));
  ASSERT_TRUE(KYBER_marshal_private_key(&cbb, &priv));
  CBS encoded_public_key_cbs;
  CBS_init(&encoded_public_key_cbs, encoded_public_key,
           sizeof(encoded_public_key));
  ASSERT_TRUE(KYBER_parse_public_key(&pub, &encoded_public_key_cbs));
  KYBER_encap_external_entropy(ciphertext, encapsulated_key, &pub,
                               encap_entropy);
  KYBER_decap(decapsulated_key, ciphertext, &priv);

  EXPECT_EQ(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(decapsulated_key)));
  EXPECT_EQ(Bytes(private_key_expected),
            Bytes(Declassified(encoded_private_key)));
  EXPECT_EQ(Bytes(public_key_expected), Bytes(encoded_public_key));
  EXPECT_EQ(Bytes(ciphertext_expected), Bytes(ciphertext));
  EXPECT_EQ(Bytes(shared_secret_expected),
            Bytes(Declassified(encapsulated_key)));

  uint8_t corrupted_ciphertext[KYBER_CIPHERTEXT_BYTES];
  OPENSSL_memcpy(corrupted_ciphertext, ciphertext, KYBER_CIPHERTEXT_BYTES);
  corrupted_ciphertext[3] ^= 0x40;
  uint8_t corrupted_decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  KYBER_decap(corrupted_decapsulated_key, corrupted_ciphertext, &priv);
  // It would be nice to have actual test vectors for the failure case, but the
  // NIST submission currently does not include those, so we are just testing
  // for inequality.
  EXPECT_NE(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(corrupted_decapsulated_key)));
}